

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

Token * __thiscall Tokenizer::parseChar(Token *__return_storage_ptr__,Tokenizer *this)

{
  _Storage<char,_true> __rhs;
  optional<char> oVar1;
  optional<char> oVar2;
  byte *pbVar3;
  TokenizerException *pTVar4;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_78;
  byte local_58 [8];
  _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_50;
  
  oVar1 = next(this);
  if (((ushort)oVar1.super__Optional_base<char,_true,_true>._M_payload.
               super__Optional_payload_base<char> >> 8 & 1) == 0) {
    pTVar4 = (TokenizerException *)__cxa_allocate_exception(0x10);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Expected char constant, found EOF","");
    TokenizerException::TokenizerException
              (pTVar4,&local_b8,this->line_number,this->col_number,&this->current_line);
    __cxa_throw(pTVar4,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
  }
  oVar2 = next(this);
  __rhs._M_value =
       oVar2.super__Optional_base<char,_true,_true>._M_payload.super__Optional_payload_base<char>.
       _M_payload;
  if (oVar1.super__Optional_base<char,_true,_true>._M_payload.super__Optional_payload_base<char>.
      _M_payload == '\\') {
    if (((ushort)oVar2.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      pTVar4 = (TokenizerException *)__cxa_allocate_exception(0x10);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Expected char constant, found EOF","");
      TokenizerException::TokenizerException
                (pTVar4,&local_b8,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar4,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    oVar1 = next(this);
    if (((ushort)oVar1.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      pTVar4 = (TokenizerException *)__cxa_allocate_exception(0x10);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Expected `\'`, found EOF","");
      TokenizerException::TokenizerException
                (pTVar4,&local_b8,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar4,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (oVar1.super__Optional_base<char,_true,_true>._M_payload.super__Optional_payload_base<char>.
        _M_payload != '\'') {
      pTVar4 = (TokenizerException *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Expected `\'`, found ","");
      std::operator+(&local_b8,&local_98,
                     oVar1.super__Optional_base<char,_true,_true>._M_payload.
                     super__Optional_payload_base<char>._M_payload);
      TokenizerException::TokenizerException
                (pTVar4,&local_b8,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar4,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_50.super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
    super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>._M_u.
    _M_first._M_storage._0_1_ = doBackslash(__rhs._M_value);
    local_50.super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
    super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>._M_index
         = 4;
    __return_storage_ptr__->type = Char;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&__return_storage_ptr__->value,
                      (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)(local_58 + 8));
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
      ::_S_vtable._M_arr
      [local_50.super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
       super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
       _M_index]._M_data)
              ((anon_class_1_0_00000001 *)&local_b8,
               (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                *)(local_58 + 8));
    pbVar3 = local_58 + 0x28;
  }
  else {
    if (((ushort)oVar2.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      pTVar4 = (TokenizerException *)__cxa_allocate_exception(0x10);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Expected `\'`, found EOF","");
      TokenizerException::TokenizerException
                (pTVar4,&local_b8,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar4,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (__rhs._M_value != '\'') {
      pTVar4 = (TokenizerException *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Expected `\'`, found ","");
      std::operator+(&local_b8,&local_98,__rhs._M_value);
      TokenizerException::TokenizerException
                (pTVar4,&local_b8,this->line_number,this->col_number,&this->current_line);
      __cxa_throw(pTVar4,&TokenizerException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_58[0] = 4;
    __return_storage_ptr__->type = Char;
    local_78._M_first._M_storage._0_1_ =
         oVar1.super__Optional_base<char,_true,_true>._M_payload.super__Optional_payload_base<char>.
         _M_payload;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&__return_storage_ptr__->value,
                      (_Move_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                       *)&local_78._M_first);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
      ::_S_vtable._M_arr[local_58[0]]._M_data)
              ((anon_class_1_0_00000001 *)&local_b8,
               (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                *)&local_78);
    pbVar3 = local_58;
  }
  *pbVar3 = 0xff;
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::parseChar() {
    optional<char> _ = next();
    if (!_.has_value()) {
        throw TokenizerException("Expected char constant, found EOF", line_number, col_number, current_line);
    }
    char c = _.value();
    if (c == '\\') {
        // Get char after backslash
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Expected char constant, found EOF", line_number, col_number, current_line);
        }
        char nextC = _.value();
        // Ensure it ends with a '
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Expected `'`, found EOF", line_number, col_number, current_line);
        }
        if (_.value() != '\'') {
            throw TokenizerException(string("Expected `'`, found ") + _.value(), line_number, col_number, current_line);
        }
        return Token(Char, doBackslash(nextC));
    } else {
        _ = next();
        if (!_.has_value()) {
            throw TokenizerException("Expected `'`, found EOF", line_number, col_number, current_line);
        }
        if (_.value() != '\'') {
            throw TokenizerException(string("Expected `'`, found ") + _.value(), line_number, col_number, current_line);
        }
        return Token(Char, c);
    }
}